

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O0

int WebPPictureAlloc(WebPPicture *picture)

{
  int iVar1;
  int *in_RDI;
  int height;
  int width;
  int in_stack_00000030;
  int in_stack_00000034;
  WebPPicture *in_stack_00000038;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI == (int *)0x0) {
    iVar1 = 1;
  }
  else {
    WebPPictureFree((WebPPicture *)0x156be2);
    if (*in_RDI == 0) {
      iVar1 = WebPPictureAllocYUVA(in_stack_00000038,in_stack_00000034,in_stack_00000030);
    }
    else {
      iVar1 = WebPPictureAllocARGB
                        ((WebPPicture *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
  }
  return iVar1;
}

Assistant:

int WebPPictureAlloc(WebPPicture* picture) {
  if (picture != NULL) {
    const int width = picture->width;
    const int height = picture->height;

    WebPPictureFree(picture);   // erase previous buffer

    if (!picture->use_argb) {
      return WebPPictureAllocYUVA(picture, width, height);
    } else {
      return WebPPictureAllocARGB(picture, width, height);
    }
  }
  return 1;
}